

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_leadingNumbers.cpp
# Opt level: O0

void __thiscall numericalwords_belowHundred_Test::TestBody(numericalwords_belowHundred_Test *this)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  ulong uVar4;
  double dVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_790;
  AssertHelper local_6e0;
  Message local_6d8;
  allocator local_6c9;
  string local_6c8;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar_12;
  Message local_690;
  allocator local_681;
  string local_680;
  undefined1 local_660 [8];
  AssertionResult gtest_ar_11;
  Message local_648;
  allocator local_639;
  string local_638;
  undefined1 local_618 [8];
  AssertionResult gtest_ar_10;
  Message local_600;
  allocator local_5f1;
  string local_5f0;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_9;
  Message local_5b8;
  allocator local_5a9;
  string local_5a8;
  undefined1 local_588 [8];
  AssertionResult gtest_ar_8;
  Message local_570;
  allocator local_561;
  string local_560;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_7;
  Message local_528;
  allocator local_519;
  string local_518;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_6;
  Message local_4e0;
  allocator local_4d1;
  string local_4d0;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_5;
  Message local_498;
  allocator local_489;
  string local_488;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_4;
  Message local_450;
  allocator local_441;
  string local_440;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_3;
  Message local_408;
  allocator local_3f9;
  string local_3f8;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_2;
  Message local_3c0;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_1;
  double val2;
  string st2;
  Message local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar;
  double val;
  undefined1 local_350 [8];
  string st;
  size_t sStack_328;
  int ii;
  size_t index;
  allocator local_318;
  allocator local_317;
  allocator local_316;
  allocator local_315;
  allocator local_314;
  allocator local_313;
  allocator local_312;
  allocator local_311;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  iterator local_1c8;
  size_type local_1c0;
  undefined1 local_1b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tens;
  allocator local_198;
  allocator local_197;
  allocator local_196;
  allocator local_195 [20];
  allocator local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ones;
  numericalwords_belowHundred_Test *this_local;
  
  tens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
  local_180 = &local_178;
  ones.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"",&local_181);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"one",local_195);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"two",&local_196);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"three",&local_197);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"four",&local_198);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d8,"five",
             (allocator *)
             ((long)&tens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b8,"six",
             (allocator *)
             ((long)&tens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,"seven",
             (allocator *)
             ((long)&tens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,"eight",
             (allocator *)
             ((long)&tens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_58,"nine",
             (allocator *)
             ((long)&tens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  tens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  local_38 = &local_178;
  local_30 = 10;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&tens.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l_00,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&tens.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  local_790 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_790 = local_790 + -1;
    std::__cxx11::string::~string((string *)local_790);
  } while (local_790 != &local_178);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator((allocator<char> *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_197);
  std::allocator<char>::~allocator((allocator<char> *)&local_196);
  std::allocator<char>::~allocator((allocator<char> *)local_195);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  index._5_1_ = 1;
  local_310 = &local_308;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_308,"",&local_311);
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"-",&local_312);
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"twenty",&local_313);
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"thirty",&local_314);
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"forty",&local_315);
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"fifty",&local_316);
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"sixty",&local_317);
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"seventy",&local_318);
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"eighty",(allocator *)((long)&index + 7));
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"ninety",(allocator *)((long)&index + 6));
  index._5_1_ = 0;
  local_1c8 = &local_308;
  local_1c0 = 10;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&index + 4));
  __l._M_len = local_1c0;
  __l._M_array = local_1c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1b8,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&index + 4));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&index + 4));
  local_850 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8;
  do {
    local_850 = local_850 + -1;
    std::__cxx11::string::~string((string *)local_850);
  } while (local_850 != &local_308);
  std::allocator<char>::~allocator((allocator<char> *)((long)&index + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&index + 7));
  std::allocator<char>::~allocator((allocator<char> *)&local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_317);
  std::allocator<char>::~allocator((allocator<char> *)&local_316);
  std::allocator<char>::~allocator((allocator<char> *)&local_315);
  std::allocator<char>::~allocator((allocator<char> *)&local_314);
  std::allocator<char>::~allocator((allocator<char> *)&local_313);
  std::allocator<char>::~allocator((allocator<char> *)&local_312);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  sStack_328 = 0;
  for (st.field_2._12_4_ = 1; (int)st.field_2._12_4_ < 100;
      st.field_2._12_4_ = st.field_2._12_4_ + 1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1b8,(long)((int)st.field_2._12_4_ / 10));
    std::__cxx11::string::string((string *)local_350,(string *)pvVar2);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_350,"-");
    if (!bVar1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_28,(long)((int)st.field_2._12_4_ % 10));
      std::__cxx11::string::operator+=((string *)local_350,(string *)pvVar2);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )units::detail::testing::testNumericalWords
                       ((string *)local_350,&stack0xfffffffffffffcd8);
      testing::internal::CmpHelperFloatingPointEQ<double>
                ((internal *)local_370,"val","static_cast<double>(ii)",
                 (double)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,(double)(int)st.field_2._12_4_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
      if (!bVar1) {
        testing::Message::Message(&local_378);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)((long)&st2.field_2 + 8),kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
                   ,0x10d,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)((long)&st2.field_2 + 8),&local_378);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&st2.field_2 + 8));
        testing::Message::~Message(&local_378);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1b8,(long)((int)st.field_2._12_4_ / 10));
      std::__cxx11::string::string((string *)&val2,(string *)pvVar2);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::__cxx11::string::push_back((char)&val2);
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_28,(long)((int)st.field_2._12_4_ % 10));
        std::__cxx11::string::operator+=((string *)&val2,(string *)pvVar2);
        pcVar3 = (char *)std::__cxx11::string::back();
        if (*pcVar3 != '-') {
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )units::detail::testing::testNumericalWords
                           ((string *)&val2,&stack0xfffffffffffffcd8);
          testing::internal::CmpHelperFloatingPointEQ<double>
                    ((internal *)local_3b8,"val2","static_cast<double>(ii)",
                     (double)gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,(double)(int)st.field_2._12_4_);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
          if (!bVar1) {
            testing::Message::Message(&local_3c0);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
                       ,0x119,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_2.message_,&local_3c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
            testing::Message::~Message(&local_3c0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
        }
      }
      std::__cxx11::string::~string((string *)&val2);
    }
    std::__cxx11::string::~string((string *)local_350);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f8,"zero",&local_3f9);
  dVar5 = units::detail::testing::testNumericalWords(&local_3f8,&stack0xfffffffffffffcd8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_3d8,"testNumericalWords(\"zero\", index)","0.0",dVar5,0.0);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x11b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_440,"ten",&local_441);
  dVar5 = units::detail::testing::testNumericalWords(&local_440,&stack0xfffffffffffffcd8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_420,"testNumericalWords(\"ten\", index)","10.0",dVar5,10.0);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_450);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x11c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_488,"eleven",&local_489);
  dVar5 = units::detail::testing::testNumericalWords(&local_488,&stack0xfffffffffffffcd8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_468,"testNumericalWords(\"eleven\", index)","11.0",dVar5,11.0);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x11d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d0,"twelve",&local_4d1);
  dVar5 = units::detail::testing::testNumericalWords(&local_4d0,&stack0xfffffffffffffcd8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_4b0,"testNumericalWords(\"twelve\", index)","12.0",dVar5,12.0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(&local_4e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x11e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_518,"thirteen",&local_519);
  dVar5 = units::detail::testing::testNumericalWords(&local_518,&stack0xfffffffffffffcd8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_4f8,"testNumericalWords(\"thirteen\", index)","13.0",dVar5,13.0);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(&local_528);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x11f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_528);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_560,"fourteen",&local_561);
  dVar5 = units::detail::testing::testNumericalWords(&local_560,&stack0xfffffffffffffcd8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_540,"testNumericalWords(\"fourteen\", index)","14.0",dVar5,14.0);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar1) {
    testing::Message::Message(&local_570);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x120,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_570);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5a8,"fifteen",&local_5a9);
  dVar5 = units::detail::testing::testNumericalWords(&local_5a8,&stack0xfffffffffffffcd8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_588,"testNumericalWords(\"fifteen\", index)","15.0",dVar5,15.0);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_588);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x121,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5f0,"sixteen",&local_5f1);
  dVar5 = units::detail::testing::testNumericalWords(&local_5f0,&stack0xfffffffffffffcd8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_5d0,"testNumericalWords(\"sixteen\", index)","16.0",dVar5,16.0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_600);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x122,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_600);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_638,"seventeen",&local_639);
  dVar5 = units::detail::testing::testNumericalWords(&local_638,&stack0xfffffffffffffcd8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_618,"testNumericalWords(\"seventeen\", index)","17.0",dVar5,17.0);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator((allocator<char> *)&local_639);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
  if (!bVar1) {
    testing::Message::Message(&local_648);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_618);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x123,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_648);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_680,"eighteen",&local_681);
  dVar5 = units::detail::testing::testNumericalWords(&local_680,&stack0xfffffffffffffcd8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_660,"testNumericalWords(\"eighteen\", index)","18.0",dVar5,18.0);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_660);
  if (!bVar1) {
    testing::Message::Message(&local_690);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_660);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x124,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_660);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6c8,"nineteen",&local_6c9);
  dVar5 = units::detail::testing::testNumericalWords(&local_6c8,&stack0xfffffffffffffcd8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_6a8,"testNumericalWords(\"nineteen\", index)","19.0",dVar5,19.0);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar1) {
    testing::Message::Message(&local_6d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_6e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x125,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6e0,&local_6d8);
    testing::internal::AssertHelper::~AssertHelper(&local_6e0);
    testing::Message::~Message(&local_6d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

TEST(numericalwords, belowHundred)
{
    std::vector<std::string> ones{
        "",
        "one",
        "two",
        "three",
        "four",
        "five",
        "six",
        "seven",
        "eight",
        "nine"};
    std::vector<std::string> tens{
        "",
        "-",
        "twenty",
        "thirty",
        "forty",
        "fifty",
        "sixty",
        "seventy",
        "eighty",
        "ninety"};
    size_t index = 0;
    for (int ii = 1; ii <= 99; ++ii) {
        std::string st = tens[ii / 10];
        if (st == "-") {
            continue;
        }
        st += ones[ii % 10];

        double val = testNumericalWords(st, index);
        EXPECT_DOUBLE_EQ(val, static_cast<double>(ii));

        std::string st2 = tens[ii / 10];
        if (st2.empty()) {
            continue;
        }
        st2.push_back('-');
        st2 += ones[ii % 10];
        if (st2.back() == '-') {
            continue;
        }
        double val2 = testNumericalWords(st2, index);
        EXPECT_DOUBLE_EQ(val2, static_cast<double>(ii));
    }
    EXPECT_DOUBLE_EQ(testNumericalWords("zero", index), 0.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("ten", index), 10.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("eleven", index), 11.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("twelve", index), 12.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("thirteen", index), 13.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("fourteen", index), 14.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("fifteen", index), 15.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("sixteen", index), 16.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("seventeen", index), 17.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("eighteen", index), 18.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("nineteen", index), 19.0);
}